

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

bool parse_json_stats(string *foz_path,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document *this;
  int iVar1;
  DatabaseInterface *pDVar2;
  long lVar3;
  bool bVar4;
  pointer puVar5;
  uint uVar6;
  Value v;
  size_t json_size;
  size_t num_hashes;
  vector<char,_std::allocator<char>_> json_buffer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  Data local_128;
  size_type local_110;
  size_type local_108;
  uint local_fc;
  Number local_f8;
  iterator iStack_f0;
  char *local_e8;
  Document *local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  long local_b8;
  pointer local_b0;
  Number local_a8;
  SizeType local_a0;
  Data local_98;
  undefined8 *local_88;
  undefined8 *puStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  int local_48;
  undefined8 local_40;
  
  local_d8 = doc;
  pDVar2 = Fossilize::create_stream_archive_database((char *)foz_path,ReadOnly);
  if (pDVar2 == (DatabaseInterface *)0x0) {
    bVar4 = false;
  }
  else {
    iVar1 = (*pDVar2->_vptr_DatabaseInterface[2])(pDVar2);
    if ((char)iVar1 == '\0') {
      bVar4 = false;
    }
    else {
      (local_d8->
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ).data_.n = (Number)0x0;
      (local_d8->
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ).data_.s.str = (Ch *)0x0;
      (local_d8->
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ).data_.f.flags = 4;
      local_f8.i64 = 0;
      iStack_f0._M_current = (char *)0x0;
      local_e8 = (char *)0x0;
      lVar3 = 0;
      do {
        local_108 = 0;
        uVar6 = *(uint *)((long)parse_json_stats(std::__cxx11::string_const&,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>&)
                                ::stat_tags + lVar3);
        local_b8 = lVar3;
        iVar1 = (*pDVar2->_vptr_DatabaseInterface[6])(pDVar2,(ulong)uVar6,&local_108,0);
        if ((char)iVar1 == '\0') {
LAB_0013b654:
          bVar4 = false;
          goto LAB_0013b656;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_d0,local_108,(allocator_type *)&local_98.s);
        iVar1 = (*pDVar2->_vptr_DatabaseInterface[6])
                          (pDVar2,(ulong)uVar6,&local_108,
                           local_d0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start);
        if ((char)iVar1 == '\0') {
          if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_d0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_0013b654;
        }
        local_b0 = local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        puVar5 = local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_fc = uVar6;
        if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            local_68 = 0;
            uStack_60 = 0;
            local_78 = 0;
            uStack_70 = 0;
            local_88 = (undefined8 *)0x0;
            puStack_80 = (undefined8 *)0x0;
            local_98.n.i64 = (Number)0x0;
            local_98.s.str = (Ch *)0x0;
            local_58 = 0;
            local_50 = 0x400;
            local_48 = 0;
            local_40 = 0;
            local_88 = (undefined8 *)operator_new(0x28);
            *local_88 = 0;
            local_88[1] = 0x10000;
            local_88[2] = 0;
            local_88[3] = 0;
            local_88[4] = 0;
            local_110 = 0;
            puStack_80 = local_88;
            iVar1 = (*pDVar2->_vptr_DatabaseInterface[3])
                              (pDVar2,(ulong)uVar6,*puVar5,&local_110,0,0);
            if ((char)iVar1 != '\0') {
              std::vector<char,_std::allocator<char>_>::resize
                        ((vector<char,_std::allocator<char>_> *)&local_f8.i,local_110);
              iVar1 = (*pDVar2->_vptr_DatabaseInterface[3])(pDVar2,(ulong)uVar6,*puVar5);
              if ((char)iVar1 != '\0') {
                local_128.n = (Number)((ulong)local_128.n & 0xffffffffffffff00);
                if (iStack_f0._M_current == local_e8) {
                  std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                            ((vector<char,_std::allocator<char>_> *)&local_f8.i,iStack_f0,
                             (char *)&local_128);
                }
                else {
                  *iStack_f0._M_current = '\0';
                  iStack_f0._M_current = iStack_f0._M_current + 1;
                }
                local_a8 = local_f8;
                local_a0 = rapidjson::GenericStringRef<char>::NotNullStrLen
                                     ((GenericStringRef<char> *)&local_a8.i,(char *)local_f8);
                local_128.n = local_a8;
                local_128.s.str = (Ch *)local_a8;
                rapidjson::
                GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                ::
                ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                          ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                            *)&local_98.s,
                           (GenericStringStream<rapidjson::UTF8<char>_> *)&local_128.s);
                this = local_d8;
                uVar6 = local_fc;
                if (local_48 == 0) {
                  local_128.n.i64 = (Number)0x0;
                  local_128.s.str = (char *)0x0;
                  if (local_d8->allocator_ == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
LAB_0013b68a:
                    __assert_fail("allocator_",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                                  ,0x9bc,
                                  "Allocator &rapidjson::GenericDocument<rapidjson::UTF8<>>::GetAllocator() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, StackAllocator = rapidjson::CrtAllocator]"
                                 );
                  }
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::CopyFrom<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)&local_128.s,
                             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)&local_98.s,local_d8->allocator_,false);
                  allocator = this->allocator_;
                  if (allocator == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0)
                  goto LAB_0013b68a;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::PushBack(&this->
                              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)&local_128.s,allocator);
                }
              }
            }
            rapidjson::
            GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                *)&local_98.s);
            puVar5 = puVar5 + 1;
          } while (puVar5 != local_b0);
        }
        if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        lVar3 = local_b8 + 4;
      } while (lVar3 != 0xc);
      bVar4 = true;
LAB_0013b656:
      if ((char *)local_f8.i64 != (char *)0x0) {
        operator_delete((void *)local_f8,(long)local_e8 - (long)local_f8);
      }
    }
    (*pDVar2->_vptr_DatabaseInterface[1])(pDVar2);
  }
  return bVar4;
}

Assistant:

static bool parse_json_stats(const std::string &foz_path, rapidjson::Document &doc)
{
	auto db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(foz_path.c_str(), DatabaseMode::ReadOnly));
	if (!db)
		return false;
	if (!db->prepare())
		return false;

	static const ResourceTag stat_tags[] = {
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
		RESOURCE_RAYTRACING_PIPELINE,
	};

	doc.SetArray();

	std::vector<char> json_buffer;

	for (auto &tag : stat_tags)
	{
		size_t num_hashes = 0;
		if (!db->get_hash_list_for_resource_tag(tag, &num_hashes, nullptr))
			return false;
		std::vector<Hash> hashes(num_hashes);
		if (!db->get_hash_list_for_resource_tag(tag, &num_hashes, hashes.data()))
			return false;

		for (auto &hash : hashes)
		{
			rapidjson::Document tmp_doc;
			size_t json_size = 0;
			if (!db->read_entry(tag, hash, &json_size, nullptr, 0))
				continue;
			json_buffer.resize(json_size);
			if (!db->read_entry(tag, hash, &json_size, json_buffer.data(), 0))
				continue;
			json_buffer.push_back('\0');

			tmp_doc.Parse(rapidjson::StringRef(json_buffer.data()));
			if (tmp_doc.HasParseError())
				continue;

			rapidjson::Value v;
			v.CopyFrom(tmp_doc, doc.GetAllocator());
			doc.PushBack(v, doc.GetAllocator());
		}
	}

	return true;
}